

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::compute_rho(Epnp *this,Matrix<double,_6,_1,_0,_6,_1> *Rho)

{
  double (*p2) [3];
  double (*p1) [3];
  double (*p2_00) [3];
  Epnp *this_00;
  double (*p2_01) [3];
  double dVar1;
  
  p2 = this->cws + 1;
  p1 = this->cws;
  this_00 = this;
  dVar1 = dist2(this,*p1,*p2);
  p2_00 = this->cws + 2;
  (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0] =
       dVar1;
  dVar1 = dist2(this_00,*p1,*p2_00);
  p2_01 = this->cws + 3;
  (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1] =
       dVar1;
  dVar1 = dist2(this_00,*p1,*p2_01);
  (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2] =
       dVar1;
  dVar1 = dist2(this_00,*p2,*p2_00);
  (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] =
       dVar1;
  dVar1 = dist2(this_00,*p2,*p2_01);
  (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4] =
       dVar1;
  dVar1 = dist2(this_00,*p2_00,*p2_01);
  (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5] =
       dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_rho(
    Eigen::Matrix<double,6,1> & Rho)
{
  Rho[0] = dist2(cws[0], cws[1]);
  Rho[1] = dist2(cws[0], cws[2]);
  Rho[2] = dist2(cws[0], cws[3]);
  Rho[3] = dist2(cws[1], cws[2]);
  Rho[4] = dist2(cws[1], cws[3]);
  Rho[5] = dist2(cws[2], cws[3]);
}